

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_pcm_rb_data_source__on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_pcm_rb *pRB;
  
  if (pFormat != (ma_format *)0x0) {
    *pFormat = *(ma_format *)((long)pDataSource + 0x88);
  }
  if (pChannels != (ma_uint32 *)0x0) {
    *pChannels = *(ma_uint32 *)((long)pDataSource + 0x8c);
  }
  if (pSampleRate != (ma_uint32 *)0x0) {
    *pSampleRate = *(ma_uint32 *)((long)pDataSource + 0x90);
  }
  if (pChannelMap != (ma_channel *)0x0) {
    ma_channel_map_init_standard
              (ma_standard_channel_map_default,pChannelMap,channelMapCap,
               *(ma_uint32 *)((long)pDataSource + 0x8c));
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    MA_ASSERT(pRB != NULL);

    if (pFormat != NULL) {
        *pFormat = pRB->format;
    }

    if (pChannels != NULL) {
        *pChannels = pRB->channels;
    }

    if (pSampleRate != NULL) {
        *pSampleRate = pRB->sampleRate;
    }

    /* Just assume the default channel map. */
    if (pChannelMap != NULL) {
        ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pRB->channels);
    }

    return MA_SUCCESS;
}